

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O3

void __thiscall
QWindowContainer::QWindowContainer
          (QWindowContainer *this,QWindow *embeddedWindow,QWidget *parent,WindowFlags flags)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  QArrayData *pQVar4;
  QString *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  QWidgetPrivate *this_00;
  undefined8 uVar8;
  QObject *pQVar9;
  long lVar10;
  undefined4 *puVar11;
  storage_type *psVar12;
  storage_type *psVar13;
  QWindowContainer *this_01;
  void **ppvVar14;
  void **ppvVar15;
  long in_FS_OFFSET;
  QAnyStringView QVar16;
  QByteArrayView QVar17;
  Connection local_b8;
  QObject local_b0 [8];
  wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> local_a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_88 [2];
  QStringBuilder<QString_&,_QLatin1String> local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)operator_new(0x298);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QWindowContainerPrivate_007e86e8;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  QWindow::QWindow((QWindow *)&this_00[1].field_0x10,(QScreen *)0x0);
  this_00[1].field_0x38 = this_00[1].field_0x38 & 0xfe;
  this_01 = this;
  QWidget::QWidget((QWidget *)this,this_00,parent,flags);
  *(undefined ***)this = &PTR_metaObject_007e8490;
  *(undefined ***)(this + 0x10) = &PTR__QWindowContainer_007e8640;
  if (embeddedWindow == (QWindow *)0x0) {
    QWindowContainer(this_01);
  }
  else {
    lVar2 = *(long *)(this + 8);
    uVar8 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)embeddedWindow);
    piVar3 = *(int **)(lVar2 + 600);
    *(undefined8 *)(lVar2 + 600) = uVar8;
    *(QWindow **)(lVar2 + 0x260) = embeddedWindow;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
      embeddedWindow = *(QWindow **)(lVar2 + 0x260);
    }
    QObject::installEventFilter((QObject *)embeddedWindow);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QObject::objectName();
    if ((char *)local_58.d.size == (char *)0x0) {
      (**(code **)**(undefined8 **)(lVar2 + 0x260))();
      lVar10 = QMetaObject::className();
      if (lVar10 == 0) {
        psVar13 = (storage_type *)0x0;
      }
      else {
        psVar12 = (storage_type *)0xffffffffffffffff;
        do {
          psVar13 = psVar12 + 1;
          pcVar1 = psVar12 + lVar10 + 1;
          psVar12 = psVar13;
        } while (*pcVar1 != '\0');
      }
      QVar17.m_data = psVar13;
      QVar17.m_size = (qsizetype)&local_78;
      QString::fromUtf8(QVar17);
      pcVar7 = local_58.d.ptr;
      pDVar6 = local_58.d.d;
      pcVar1 = local_78.b.m_data;
      pQVar5 = local_78.a;
      pQVar4 = (QArrayData *)local_78.a;
      local_58.d.ptr = (char16_t *)local_78.b.m_size;
      local_78.a = (QString *)local_58.d.d;
      local_58.d.d = (Data *)pQVar5;
      local_78.b.m_size = (qsizetype)pcVar7;
      local_78.b.m_data = (char *)local_58.d.size;
      local_58.d.size = (qsizetype)pcVar1;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
        }
      }
    }
    local_78.b.m_size = 0x13;
    local_78.b.m_data = "ContainerFakeParent";
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    local_78.a = &local_58;
    QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
              ((QAnyStringView *)local_88,&local_78,&local_a8);
    QVar16.m_size = (size_t)local_88[0].m_data;
    QVar16.field_0.m_data = (void *)(lVar2 + 0x268);
    QObject::setObjectName(QVar16);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QWindow::setParent(*(QWindow **)(lVar2 + 0x260));
    ppvVar15 = (void **)0x0;
    pQVar9 = (QObject *)QWindow::parent(*(undefined8 *)(lVar2 + 0x260),0);
    QObject::installEventFilter(pQVar9);
    QWindow::setFlag((WindowType)*(undefined8 *)(lVar2 + 0x260),true);
    QWidget::setAcceptDrops((QWidget *)this,true);
    lVar2 = *(long *)(*(long *)(this + 8) + 600);
    if (lVar2 != 0) {
      if (*(int *)(lVar2 + 4) == 0) {
        ppvVar15 = (void **)0x0;
      }
      else {
        ppvVar15 = *(void ***)(*(long *)(this + 8) + 0x260);
      }
    }
    local_a8.d.d = (Data *)QWidget::updateGeometry;
    ppvVar14 = (void **)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_78.a = (QString *)QWindow::minimumHeightChanged;
    local_78.b.m_size = 0;
    puVar11 = (undefined4 *)operator_new(0x20);
    *puVar11 = 1;
    *(code **)(puVar11 + 2) =
         QtPrivate::QCallableObject<void_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar11 + 4) = QWidget::updateGeometry;
    *(undefined8 *)(puVar11 + 6) = 0;
    QObject::connectImpl
              (local_b0,ppvVar15,(QObject *)&local_78,(void **)this,(QSlotObjectBase *)&local_a8,
               (ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_b0);
    lVar2 = *(long *)(*(long *)(this + 8) + 600);
    if (lVar2 != 0) {
      if (*(int *)(lVar2 + 4) == 0) {
        ppvVar14 = (void **)0x0;
      }
      else {
        ppvVar14 = *(void ***)(*(long *)(this + 8) + 0x260);
      }
    }
    local_a8.d.d = (Data *)QWidget::updateGeometry;
    local_a8.d.ptr = (char16_t *)0x0;
    local_78.a = (QString *)QWindow::minimumWidthChanged;
    local_78.b.m_size = 0;
    puVar11 = (undefined4 *)operator_new(0x20);
    *puVar11 = 1;
    *(code **)(puVar11 + 2) =
         QtPrivate::QCallableObject<void_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar11 + 4) = QWidget::updateGeometry;
    *(undefined8 *)(puVar11 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_b8,ppvVar14,(QObject *)&local_78,(void **)this,
               (QSlotObjectBase *)&local_a8,(ConnectionType)puVar11,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_b8);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWindowContainer::QWindowContainer(QWindow *embeddedWindow, QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QWindowContainerPrivate, parent, flags)
{
    Q_D(QWindowContainer);
    if (Q_UNLIKELY(!embeddedWindow)) {
        qWarning("QWindowContainer: embedded window cannot be null");
        return;
    }

    d->window = embeddedWindow;
    d->window->installEventFilter(this);

    QString windowName = d->window->objectName();
    if (windowName.isEmpty())
        windowName = QString::fromUtf8(d->window->metaObject()->className());
    d->fakeParent.setObjectName(windowName + "ContainerFakeParent"_L1);

    d->window->setParent(&d->fakeParent);
    d->window->parent()->installEventFilter(this);
    d->window->setFlag(Qt::SubWindow);

    setAcceptDrops(true);

    connect(containedWindow(), &QWindow::minimumHeightChanged, this, &QWindowContainer::updateGeometry);
    connect(containedWindow(), &QWindow::minimumWidthChanged, this, &QWindowContainer::updateGeometry);
}